

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_ext.cpp
# Opt level: O2

__ssize_t cs_impl::istream_cs_ext::getline_abi_cxx11_(char **__lineptr,size_t *__n,FILE *__stream)

{
  string str;
  char *local_30;
  char *local_28;
  char local_20;
  undefined7 uStack_1f;
  char *pcStack_18;
  
  local_28 = (char *)0x0;
  local_20 = '\0';
  local_30 = &local_20;
  std::getline<char,std::char_traits<char>,std::allocator<char>>
            ((istream *)*__n,(string *)&local_30);
  *__lineptr = (char *)(__lineptr + 2);
  if (local_30 == &local_20) {
    __lineptr[2] = (char *)CONCAT71(uStack_1f,local_20);
    __lineptr[3] = pcStack_18;
  }
  else {
    *__lineptr = local_30;
    __lineptr[2] = (char *)CONCAT71(uStack_1f,local_20);
  }
  __lineptr[1] = local_28;
  local_28 = (char *)0x0;
  local_20 = '\0';
  local_30 = &local_20;
  std::__cxx11::string::~string((string *)&local_30);
  return (__ssize_t)__lineptr;
}

Assistant:

var to_list(const array &arr)
		{
			var lst = var::make<list>(arr.begin(), arr.end());
			lst.detach();
			return std::move(lst);
		}